

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueList::read(PLYValueList *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  PLYValue *pPVar4;
  ssize_t sVar5;
  undefined4 extraout_var_00;
  undefined4 in_register_00000034;
  size_t sVar6;
  undefined4 extraout_var;
  
  (*this->size->_vptr_PLYValue[2])();
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  uVar3 = (long)(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar3 < uVar1) {
    this->used = uVar3;
    uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
    std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::resize(&this->list,(ulong)uVar1)
    ;
    for (sVar6 = this->used;
        sVar6 < (ulong)((long)(this->list).
                              super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->list).
                              super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); sVar6 = sVar6 + 1) {
      pPVar4 = createValue(this->tvalue,this->enc);
      (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar6] = pPVar4;
    }
  }
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  sVar5 = CONCAT44(extraout_var,uVar1);
  this->used = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      pPVar4 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3];
      iVar2 = (*pPVar4->_vptr_PLYValue[2])(pPVar4,CONCAT44(in_register_00000034,__fd));
      sVar5 = CONCAT44(extraout_var_00,iVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->used);
  }
  return sVar5;
}

Assistant:

void read(std::streambuf *in)
    {
      size->read(in);

      if (size->getUnsignedInt() > list.size())
      {
        used=list.size();
        list.resize(size->getUnsignedInt());

        for (size_t i=used; i<list.size(); i++)
        {
          list[i]=createValue(tvalue, enc);
        }
      }

      used=size->getUnsignedInt();

      for (size_t i=0; i<used; i++)
      {
        list[i]->read(in);
      }
    }